

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::check_present_values
          (tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  anon_class_24_3_0ccd3248 fn_00;
  bool bVar1;
  reference __in;
  type *ptVar2;
  type *ptVar3;
  value_view expected;
  int in_stack_ffffffffffffff38;
  anon_class_24_3_0ccd3248 fn;
  key_view prev;
  undefined8 uStack_60;
  bool first;
  size_t n;
  pointer pbStack_50;
  pause_heap_faults guard;
  type *value;
  type *key;
  _Self local_28;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *__range3;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  __end1 = std::
           map<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ::begin(&this->values);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
       ::end(&this->values);
  while( true ) {
    bVar1 = std::operator==(&__end1,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           ::operator*(&__end1);
    ptVar2 = std::get<0ul,unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>
                       (__in);
    ptVar3 = std::get<1ul,unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>
                       (__in);
    pbStack_50 = ptVar3->_M_ptr;
    expected._M_extent._M_extent_value =
         (size_t)
         "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
    ;
    expected._M_ptr = (pointer)(ptVar3->_M_extent)._M_extent_value;
    detail::
    assert_result_eq<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ((detail *)&this->test_db,
               (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
               *ptVar2,(key_type)pbStack_50,expected,(char *)0x258,in_stack_ffffffffffffff38);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::operator++(&__end1);
  }
  pause_heap_faults::pause_heap_faults((pause_heap_faults *)((long)&n + 7));
  uStack_60 = 0;
  prev._M_extent._M_extent_value._7_1_ = 1;
  std::span<const_std::byte,_18446744073709551615UL>::span
            ((span<const_std::byte,_18446744073709551615UL> *)&fn.prev);
  fn.n = (size_t *)((long)&prev._M_extent._M_extent_value + 7);
  fn.first = (bool *)&fn.prev;
  fn_00.first = (bool *)fn.n;
  fn_00.n = &stack0xffffffffffffffa0;
  fn_00.prev = (key_view *)fn.first;
  mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
  scan<unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::check_present_values()const::_lambda(unodb::visitor<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator>const&)_1_>
            ((mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)
             &this->test_db,fn_00,true);
  pause_heap_faults::~pause_heap_faults((pause_heap_faults *)((long)&n + 7));
  return;
}

Assistant:

void check_present_values() const {
    // Probe the test_db for each key, verifying the expected value is found
    // under that key.
    UNODB_DETAIL_DISABLE_MSVC_WARNING(26445)
    for (const auto &[key, value] : values) {
      if constexpr (std::is_same_v<typename Db::key_type, unodb::key_view>) {
        ASSERT_VALUE_FOR_KEY(Db, test_db, *key, value);
      } else {
        ASSERT_VALUE_FOR_KEY(Db, test_db, key, value);
      }
    }
    UNODB_DETAIL_RESTORE_MSVC_WARNINGS()
    // Scan the test_db.  For each (key,val) visited, verify (a) that each key
    // is visited in lexicographic order; and (b) that each (key,val) pair also
    // appears in the ground truth collection.
    //
    // Note: This depends on the ability to decode the key. Therefore, the
    // caller SHOULD disable this scan when the keys do not support 100%
    // faithful round-trip encoding and decoding.
    UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
    std::size_t n{0};
    bool first = true;
    unodb::key_view prev{};
    auto fn =
        [&n, &first,
         &prev](const unodb::visitor<typename Db::iterator> &visitor) noexcept {
          // We can't tell cheap and expensive to copy types apart in an
          // useful way here
          UNODB_DETAIL_DISABLE_MSVC_WARNING(26445)
          const auto &kv = visitor.get_key();
          UNODB_DETAIL_RESTORE_MSVC_WARNINGS()

          if (UNODB_DETAIL_UNLIKELY(first)) {
            prev = kv;
            first = false;
          } else {
            UNODB_EXPECT_LT(unodb::detail::compare(prev, kv), 0);
            prev = kv;
          }
          n++;
          return false;
        };
    const_cast<Db &>(test_db).scan(fn);
    // FIXME(thompsonbry) variable length keys - enable this assert.
    // 3 OOM tests are failing (for each Db type) when this is enabled
    // (off by one).  What is going on there?
    //
    // const auto sz = values.size();  // #of (key,val) pairs expected.
    // UNODB_EXPECT_EQ(sz, n);
  }